

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall ClipperLib::PolyOffsetBuilder::AddPoint(PolyOffsetBuilder *this,IntPoint *pt)

{
  pointer pIVar1;
  vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *this_00;
  
  this_00 = this->m_curr_poly;
  pIVar1 = (this_00->super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pIVar1 == (this_00->
                super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::reserve
              (this_00,((long)pIVar1 -
                        (long)(this_00->
                              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 4) + 0x80);
    this_00 = this->m_curr_poly;
  }
  std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::push_back(this_00,pt);
  return;
}

Assistant:

void AddPoint(const IntPoint& pt)
{
    Polygon::size_type len = m_curr_poly->size();
    if (len == m_curr_poly->capacity())
        m_curr_poly->reserve(len + buffLength);
    m_curr_poly->push_back(pt);
}